

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetInternals::ComputeLinkImplementationLibraries
          (cmTargetInternals *this,cmTarget *thisTarget,string *config,
          OptionalLinkImplementation *impl,cmTarget *head)

{
  cmMakefile *mf;
  bool bVar1;
  __type _Var2;
  PolicyStatus PVar3;
  LinkLibraryType LVar4;
  pointer pcVar5;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmCompiledGeneratorExpression *pcVar6;
  char *pcVar7;
  reference item;
  ostream *poVar8;
  cmake *this_00;
  cmListFileBacktrace *bt;
  pointer __rhs;
  reference pbVar9;
  pointer ppVar10;
  string *psVar11;
  ulong uVar12;
  cmTarget *pcVar13;
  PolicyID id;
  cmLinkItem local_4a0;
  undefined1 local_478 [8];
  string name_1;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
  local_450;
  const_iterator li_1;
  LinkLibraryVectorType *oldllibs;
  LinkLibraryType linkType;
  _Self local_428;
  _Self local_420;
  const_iterator it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *seenProps;
  int local_3ac;
  string local_3a8;
  string local_388;
  undefined1 local_368 [8];
  ostringstream e;
  MessageType local_1f0;
  MessageType messageType;
  bool noMessage;
  string name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  const_iterator li;
  string local_1a8;
  undefined1 local_188 [8];
  string evaluated;
  auto_ptr<cmCompiledGeneratorExpression> local_158;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  string local_140;
  undefined1 local_110 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  const_iterator end;
  const_iterator le;
  cmTarget *head_local;
  OptionalLinkImplementation *impl_local;
  string *config_local;
  cmTarget *thisTarget_local;
  cmTargetInternals *this_local;
  
  end = std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::begin
                  (&this->LinkImplementationPropertyEntries);
  llibs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::end
                          (&this->LinkImplementationPropertyEntries);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                             *)&llibs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      LVar4 = cmTarget::ComputeLinkType(thisTarget,config);
      li_1._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>
            *)cmTarget::GetOriginalLinkLibraries_abi_cxx11_(thisTarget);
      local_450._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                       *)li_1._M_current);
      while( true ) {
        name_1.field_2._8_8_ =
             std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
             ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>
                    *)li_1._M_current);
        bVar1 = __gnu_cxx::operator!=
                          (&local_450,
                           (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                            *)((long)&name_1.field_2 + 8));
        if (!bVar1) break;
        ppVar10 = __gnu_cxx::
                  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                  ::operator->(&local_450);
        if ((ppVar10->second != GENERAL) &&
           (ppVar10 = __gnu_cxx::
                      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                      ::operator->(&local_450), ppVar10->second != LVar4)) {
          ppVar10 = __gnu_cxx::
                    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
                    ::operator->(&local_450);
          cmTarget::CheckCMP0004((string *)local_478,thisTarget,&ppVar10->first);
          psVar11 = cmTarget::GetName_abi_cxx11_(thisTarget);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_478,psVar11);
          if ((_Var2) || (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
            local_3ac = 0xe;
          }
          else {
            pcVar13 = cmTarget::FindTargetToLink(thisTarget,(string *)local_478);
            cmLinkItem::cmLinkItem(&local_4a0,(std_string *)local_478,pcVar13);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::push_back
                      (&(impl->super_LinkImplementation).super_LinkImplementationLibraries.
                        WrongConfigLibraries,&local_4a0);
            cmLinkItem::~cmLinkItem(&local_4a0);
            local_3ac = 0;
          }
          std::__cxx11::string::~string((string *)local_478);
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::LinkLibraryType>_>_>_>
        ::operator++(&local_450);
      }
      return;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&dagChecker.CheckResult);
    psVar11 = cmTarget::GetName_abi_cxx11_(thisTarget);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_140,"LINK_LIBRARIES",(allocator *)((long)&ge.Backtrace + 7));
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_110,psVar11,&local_140,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ge.Backtrace + 7));
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
             ::operator->(&end);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&cge,&pcVar5->Backtrace);
    __gnu_cxx::
    __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
    ::operator->(&end);
    cmGeneratorExpression::Parse
              ((cmGeneratorExpression *)((long)&evaluated.field_2 + 8),(string *)&cge);
    r = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref
                  ((auto_ptr *)(evaluated.field_2._M_local_buf + 8));
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_158,r);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(evaluated.field_2._M_local_buf + 8));
    pcVar6 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_158);
    mf = thisTarget->Makefile;
    std::__cxx11::string::string((string *)&local_1a8);
    pcVar7 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar6,mf,config,false,head,(cmGeneratorExpressionDAGChecker *)local_110,
                        &local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_188,pcVar7,(allocator *)((long)&li._M_current + 7))
    ;
    std::allocator<char>::~allocator((allocator<char> *)((long)&li._M_current + 7));
    std::__cxx11::string::~string((string *)&local_1a8);
    cmSystemTools::ExpandListArgument
              ((string *)local_188,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&dagChecker.CheckResult,false);
    pcVar6 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_158);
    bVar1 = cmCompiledGeneratorExpression::GetHadHeadSensitiveCondition(pcVar6);
    if (bVar1) {
      impl->HadHeadSensitiveCondition = true;
    }
    local_1c0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dagChecker.CheckResult);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1b8,&local_1c0);
    while( true ) {
      name.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dagChecker.CheckResult);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1b8,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&name.field_2 + 8));
      if (!bVar1) break;
      item = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_1b8);
      cmTarget::CheckCMP0004((string *)&messageType,thisTarget,item);
      psVar11 = cmTarget::GetName_abi_cxx11_(thisTarget);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &messageType,psVar11);
      if ((_Var2) || (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) != 0)) {
        psVar11 = cmTarget::GetName_abi_cxx11_(thisTarget);
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&messageType,psVar11);
        if (_Var2) {
          bVar1 = false;
          local_1f0 = FATAL_ERROR;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_368);
          PVar3 = cmTarget::GetPolicyStatusCMP0038(thisTarget);
          if (PVar3 == OLD) {
            bVar1 = true;
          }
          else if (PVar3 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_388,(cmPolicies *)0x26,id);
            poVar8 = std::operator<<((ostream *)local_368,(string *)&local_388);
            std::operator<<(poVar8,"\n");
            std::__cxx11::string::~string((string *)&local_388);
            local_1f0 = AUTHOR_WARNING;
          }
          if (bVar1) {
LAB_00615a80:
            local_3ac = 0;
          }
          else {
            poVar8 = std::operator<<((ostream *)local_368,"Target \"");
            psVar11 = cmTarget::GetName_abi_cxx11_(thisTarget);
            poVar8 = std::operator<<(poVar8,(string *)psVar11);
            std::operator<<(poVar8,"\" links to itself.");
            this_00 = cmMakefile::GetCMakeInstance(thisTarget->Makefile);
            std::__cxx11::ostringstream::str();
            bt = cmTarget::GetBacktrace(thisTarget);
            cmake::IssueMessage(this_00,local_1f0,&local_3a8,bt);
            std::__cxx11::string::~string((string *)&local_3a8);
            if (local_1f0 != FATAL_ERROR) goto LAB_00615a80;
            local_3ac = 1;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_368);
          if (local_3ac != 0) goto LAB_00615b74;
        }
        local_3ac = 7;
      }
      else {
        pcVar13 = cmTarget::FindTargetToLink(thisTarget,(string *)&messageType);
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                 ::operator->(&end);
        __rhs = __gnu_cxx::
                __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
                ::operator->(&end);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_188,&__rhs->Value);
        cmLinkImplItem::cmLinkImplItem
                  ((cmLinkImplItem *)&seenProps,(string *)&messageType,pcVar13,&pcVar5->Backtrace,
                   bVar1);
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::push_back
                  ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)impl,
                   (value_type *)&seenProps);
        cmLinkImplItem::~cmLinkImplItem((cmLinkImplItem *)&seenProps);
        local_3ac = 0;
      }
LAB_00615b74:
      std::__cxx11::string::~string((string *)&messageType);
      if ((local_3ac != 0) && (local_3ac != 7)) goto LAB_00615d23;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1b8);
    }
    pcVar6 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_158);
    it._M_node = (_Base_ptr)
                 cmCompiledGeneratorExpression::GetSeenTargetProperties_abi_cxx11_(pcVar6);
    local_420._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)it._M_node);
    while( true ) {
      local_428._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(it._M_node);
      bVar1 = std::operator!=(&local_420,&local_428);
      if (!bVar1) break;
      pbVar9 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_420);
      pcVar7 = cmTarget::GetProperty(thisTarget,pbVar9);
      if (pcVar7 == (char *)0x0) {
        pbVar9 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_420);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&thisTarget->LinkImplicitNullProperties,pbVar9);
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_420);
    }
    pcVar6 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_158);
    cmCompiledGeneratorExpression::GetMaxLanguageStandard
              (pcVar6,thisTarget,&thisTarget->MaxLanguageStandards);
    local_3ac = 0;
LAB_00615d23:
    std::__cxx11::string::~string((string *)local_188);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_158);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&dagChecker.CheckResult);
    if (local_3ac != 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_cmValueWithOrigin_*,_std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

void
cmTargetInternals::ComputeLinkImplementationLibraries(
  cmTarget const* thisTarget,
  const std::string& config,
  OptionalLinkImplementation& impl,
  cmTarget const* head) const
{
  // Collect libraries directly linked in this configuration.
  for (std::vector<cmValueWithOrigin>::const_iterator
      le = this->LinkImplementationPropertyEntries.begin(),
      end = this->LinkImplementationPropertyEntries.end();
      le != end; ++le)
    {
    std::vector<std::string> llibs;
    cmGeneratorExpressionDAGChecker dagChecker(
                                        thisTarget->GetName(),
                                        "LINK_LIBRARIES", 0, 0);
    cmGeneratorExpression ge(&le->Backtrace);
    cmsys::auto_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(le->Value);
    std::string const evaluated =
      cge->Evaluate(thisTarget->Makefile, config, false, head, &dagChecker);
    cmSystemTools::ExpandListArgument(evaluated, llibs);
    if(cge->GetHadHeadSensitiveCondition())
      {
      impl.HadHeadSensitiveCondition = true;
      }

    for(std::vector<std::string>::const_iterator li = llibs.begin();
        li != llibs.end(); ++li)
      {
      // Skip entries that resolve to the target itself or are empty.
      std::string name = thisTarget->CheckCMP0004(*li);
      if(name == thisTarget->GetName() || name.empty())
        {
        if(name == thisTarget->GetName())
          {
          bool noMessage = false;
          cmake::MessageType messageType = cmake::FATAL_ERROR;
          std::ostringstream e;
          switch(thisTarget->GetPolicyStatusCMP0038())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }

          if(!noMessage)
            {
            e << "Target \"" << thisTarget->GetName() << "\" links to itself.";
            thisTarget->Makefile->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), thisTarget->GetBacktrace());
            if (messageType == cmake::FATAL_ERROR)
              {
              return;
              }
            }
          }
        continue;
        }

      // The entry is meant for this configuration.
      impl.Libraries.push_back(
        cmLinkImplItem(name, thisTarget->FindTargetToLink(name),
                       le->Backtrace, evaluated != le->Value));
      }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::set<std::string>::const_iterator it = seenProps.begin();
        it != seenProps.end(); ++it)
      {
      if (!thisTarget->GetProperty(*it))
        {
        thisTarget->LinkImplicitNullProperties.insert(*it);
        }
      }
    cge->GetMaxLanguageStandard(thisTarget, thisTarget->MaxLanguageStandards);
    }

  cmTarget::LinkLibraryType linkType = thisTarget->ComputeLinkType(config);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    thisTarget->GetOriginalLinkLibraries();
  for(cmTarget::LinkLibraryVectorType::const_iterator li = oldllibs.begin();
      li != oldllibs.end(); ++li)
    {
    if(li->second != cmTarget::GENERAL && li->second != linkType)
      {
      std::string name = thisTarget->CheckCMP0004(li->first);
      if(name == thisTarget->GetName() || name.empty())
        {
        continue;
        }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        cmLinkItem(name, thisTarget->FindTargetToLink(name)));
      }
    }
}